

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

void end_pass(ftrl *g)

{
  bool bVar1;
  long *in_RDI;
  vw *all;
  string *in_stack_000000a8;
  vw *in_stack_000000b0;
  size_t *in_stack_ffffffffffffffb0;
  vw *in_stack_ffffffffffffffb8;
  string local_30 [32];
  long local_10;
  long *local_8;
  
  local_10 = *in_RDI;
  if ((*(byte *)(local_10 + 0x3457) & 1) == 0) {
    local_8 = in_RDI;
    bVar1 = summarize_holdout_set(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (bVar1) {
      std::__cxx11::string::string(local_30,(string *)(local_10 + 0x3570));
      finalize_regressor(in_stack_000000b0,in_stack_000000a8);
      std::__cxx11::string::~string(local_30);
    }
    if ((local_8[6] == local_8[5]) &&
       ((*(ulong *)(local_10 + 0x3468) < 2 ||
        (*(ulong *)(local_10 + 0x48) % *(ulong *)(local_10 + 0x3468) == 0)))) {
      set_done((vw *)0x2c3542);
    }
  }
  return;
}

Assistant:

void end_pass(ftrl& g)
{
  vw& all = *g.all;

  if (!all.holdout_set_off)
  {
    if (summarize_holdout_set(all, g.no_win_counter))
      finalize_regressor(all, all.final_regressor_name);
    if ((g.early_stop_thres == g.no_win_counter) &&
        ((all.check_holdout_every_n_passes <= 1) || ((all.current_pass % all.check_holdout_every_n_passes) == 0)))
      set_done(all);
  }
}